

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# proposal.cpp
# Opt level: O3

int __thiscall
ncnn::Proposal::forward
          (Proposal *this,vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *bottom_blobs,
          vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *top_blobs,Option *opt)

{
  float fVar1;
  undefined4 uVar2;
  undefined8 uVar3;
  undefined4 uVar4;
  uint _c;
  long lVar5;
  Mat *this_00;
  size_t sVar6;
  size_t sVar7;
  pointer pMVar8;
  int *piVar9;
  bool bVar10;
  pointer pRVar11;
  pointer pRVar12;
  undefined8 *puVar13;
  undefined1 (*pauVar14) [16];
  int iVar15;
  void *pvVar16;
  ulong uVar17;
  Rect *pRVar18;
  long lVar19;
  ulong uVar20;
  long lVar21;
  undefined1 (*pauVar22) [16];
  void *pvVar23;
  void *pvVar24;
  float *pfVar25;
  uint _h;
  int iVar26;
  void *pvVar27;
  float *__args;
  ulong uVar28;
  float fVar29;
  float fVar30;
  undefined1 auVar31 [16];
  float fVar32;
  float fVar33;
  float fVar34;
  float fVar35;
  float fVar36;
  float fVar37;
  vector<unsigned_long,_std::allocator<unsigned_long>_> picked;
  vector<ncnn::Rect,_std::allocator<ncnn::Rect>_> proposal_boxes;
  vector<float,_std::allocator<float>_> scores;
  Mat m;
  undefined1 local_278 [8];
  undefined8 uStack_270;
  unsigned_long *local_268;
  vector<ncnn::Rect,_std::allocator<ncnn::Rect>_> local_258;
  vector<float,_std::allocator<float>_> local_238;
  pointer local_218;
  ulong local_210;
  undefined1 (*local_208) [16];
  unsigned_long local_200;
  float local_1f4;
  float local_1f0;
  float local_1ec;
  float local_1e8;
  undefined4 uStack_1e4;
  undefined4 uStack_1e0;
  undefined4 uStack_1dc;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *local_1d0;
  ulong local_1c8;
  void *local_1c0;
  void *local_1b8;
  undefined1 (*local_1b0) [16];
  void *local_1a8;
  void *local_1a0;
  ulong local_198;
  void *local_190;
  ulong local_188;
  ulong local_180;
  Mat local_178;
  vector<float,_std::allocator<float>_> local_128;
  int local_110;
  Allocator *local_108;
  uint local_100;
  int local_fc;
  int local_f8;
  undefined4 local_f4;
  int local_f0;
  long local_e8;
  long local_e0;
  long local_d8;
  long local_d0;
  long local_c8;
  long local_c0;
  long local_b8;
  ulong local_b0;
  ulong local_a8;
  void *local_a0;
  float local_98;
  float fStack_94;
  float fStack_90;
  float fStack_8c;
  float fStack_80;
  float fStack_7c;
  undefined8 local_78;
  undefined8 uStack_70;
  float local_68;
  float fStack_64;
  float fStack_60;
  float fStack_5c;
  float local_58;
  undefined1 local_48 [24];
  
  local_218 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
              super__Vector_impl_data._M_start;
  local_188 = (ulong)local_218->w;
  local_180 = (ulong)(uint)local_218->h;
  _c = (this->anchors).h;
  local_178.cstep = 0;
  local_178.data = (undefined1 (*) [16])0x0;
  local_178.refcount._0_4_ = 0;
  local_178.refcount._4_4_ = 0;
  local_178.elemsize._0_4_ = 0;
  local_178.elemsize._4_4_ = 0;
  local_178.elempack = 0;
  local_178.allocator = (Allocator *)0x0;
  local_178.dims = 0;
  local_178.w = 0;
  local_178.h = 0;
  local_178.d = 0;
  local_178.c = 0;
  _h = local_218->h * local_218->w;
  local_1d0 = top_blobs;
  Mat::create(&local_178,4,_h,_c,4,(Allocator *)0x0);
  local_1c8 = (ulong)_h;
  local_198 = (ulong)_c;
  if ((int)_c < 1) {
    puVar13 = (undefined8 *)local_218[2].data;
  }
  else {
    local_a8 = local_188 & 0xffffffff;
    local_1a0 = local_218[1].data;
    lVar19 = local_218[1].cstep * local_218[1].elemsize;
    local_1b0 = (undefined1 (*) [16])local_178.data;
    local_190 = (this->anchors).data;
    local_1f4 = (float)this->feat_stride;
    local_e0 = (long)(this->anchors).w * (this->anchors).elemsize;
    local_d0 = local_178.cstep * CONCAT44(local_178.elemsize._4_4_,(undefined4)local_178.elemsize);
    lVar21 = (long)local_178.w * CONCAT44(local_178.elemsize._4_4_,(undefined4)local_178.elemsize);
    local_b8 = lVar21 * local_a8;
    local_1b8 = (void *)(lVar19 * 3 + (long)local_1a0);
    local_d8 = lVar19 * 4;
    local_c0 = local_188 * 4;
    local_1c0 = (void *)((long)local_1a0 + lVar19 * 2);
    local_1a8 = (void *)(lVar19 + (long)local_1a0);
    local_210 = 0;
    do {
      if (0 < (int)local_180) {
        local_c8 = local_e0 * local_210;
        fVar29 = (float)((ulong)*(undefined8 *)((long)local_190 + local_c8) >> 0x20);
        uVar3 = *(undefined8 *)((long)local_190 + local_c8 + 8);
        fVar33 = (float)uVar3 - (float)*(undefined8 *)((long)local_190 + local_c8);
        fVar35 = (float)((ulong)uVar3 >> 0x20) - fVar29;
        fStack_80 = fVar33 * 0.5;
        fStack_7c = fVar35 * 0.5;
        local_1f0 = (float)this->feat_stride;
        local_208 = local_1b0;
        uVar28 = 0;
        local_78 = CONCAT44(fVar35,fVar33);
        uStack_70 = 0;
        pvVar16 = local_1a0;
        pvVar23 = local_1b8;
        pvVar24 = local_1a8;
        pvVar27 = local_1c0;
        fVar30 = fVar29;
        fVar34 = fVar29;
        fVar32 = fVar29;
        local_98 = fVar35;
        fStack_94 = fVar35;
        fStack_90 = fVar35;
        fStack_8c = fVar35;
        do {
          local_b0 = uVar28;
          if (0 < (int)local_188) {
            fVar36 = *(float *)((long)local_190 + local_c8);
            uStack_1e4 = 0;
            uStack_1e0 = 0;
            uStack_1dc = 0;
            uVar28 = 0;
            pauVar14 = local_208;
            local_a0 = pvVar23;
            local_68 = fVar29;
            fStack_64 = fVar30;
            fStack_60 = fVar34;
            fStack_5c = fVar32;
            do {
              local_1ec = *(float *)((long)local_a0 + uVar28 * 4);
              local_48._4_4_ = 0;
              local_48._0_4_ = (*(float *)((long)pvVar24 + uVar28 * 4) + 0.5) * fVar35;
              local_48._8_4_ = (*(float *)((long)pvVar16 + uVar28 * 4) + 0.5) * fVar33;
              local_48._12_4_ = 0;
              local_1e8 = fVar36;
              local_58 = expf(*(float *)((long)pvVar27 + uVar28 * 4));
              fVar29 = expf(local_1ec);
              *(float *)*pauVar14 = ((float)local_48._8_4_ + local_1e8) - local_58 * fStack_80;
              *(float *)(*pauVar14 + 4) = ((float)local_48._0_4_ + local_68) - fVar29 * fStack_7c;
              *(float *)(*pauVar14 + 8) = (float)local_48._8_4_ + local_1e8 + local_58 * fStack_80;
              *(float *)(*pauVar14 + 0xc) = (float)local_48._0_4_ + local_68 + fVar29 * fStack_7c;
              fVar36 = local_1e8 + local_1f0;
              uVar28 = uVar28 + 1;
              pauVar14 = (undefined1 (*) [16])(*pauVar14 + lVar21);
              pvVar23 = local_a0;
              fVar29 = local_68;
              fVar30 = fStack_64;
              fVar34 = fStack_60;
              fVar32 = fStack_5c;
              fVar33 = (float)local_78;
              fVar35 = local_98;
            } while (local_a8 != uVar28);
          }
          fVar29 = fVar29 + local_1f4;
          uVar28 = local_b0 + 1;
          local_208 = (undefined1 (*) [16])(*local_208 + local_b8);
          pvVar23 = (void *)((long)pvVar23 + local_c0);
          pvVar27 = (void *)((long)pvVar27 + local_c0);
          pvVar24 = (void *)((long)pvVar24 + local_c0);
          pvVar16 = (void *)((long)pvVar16 + local_c0);
        } while (uVar28 != local_180);
      }
      local_210 = local_210 + 1;
      local_1b0 = (undefined1 (*) [16])(*local_1b0 + local_d0);
      local_1b8 = (void *)((long)local_1b8 + local_d8);
      local_1c0 = (void *)((long)local_1c0 + local_d8);
      local_1a8 = (void *)((long)local_1a8 + local_d8);
      local_1a0 = (void *)((long)local_1a0 + local_d8);
    } while (local_210 != local_198);
    puVar13 = (undefined8 *)local_218[2].data;
    if (0 < (int)local_198) {
      fVar29 = (float)*puVar13;
      fVar30 = (float)((ulong)*puVar13 >> 0x20);
      uVar28 = 0;
      pauVar14 = (undefined1 (*) [16])local_178.data;
      do {
        uVar20 = local_1c8;
        pauVar22 = pauVar14;
        if (0 < (int)_h) {
          do {
            auVar31._4_4_ = fVar29 + -1.0;
            auVar31._0_4_ = fVar30 + -1.0;
            auVar31._8_4_ = fVar30 + -1.0;
            auVar31._12_4_ = fVar29 + -1.0;
            auVar31 = minps(*pauVar22,auVar31);
            auVar31 = maxps(auVar31,ZEXT816(0));
            *pauVar22 = auVar31;
            pauVar22 = (undefined1 (*) [16])
                       (*pauVar22 +
                       (long)local_178.w *
                       CONCAT44(local_178.elemsize._4_4_,(undefined4)local_178.elemsize));
            uVar20 = uVar20 - 1;
          } while (uVar20 != 0);
        }
        uVar28 = uVar28 + 1;
        pauVar14 = (undefined1 (*) [16])
                   (*pauVar14 +
                   CONCAT44(local_178.elemsize._4_4_,(undefined4)local_178.elemsize) *
                   local_178.cstep);
      } while (uVar28 != local_198);
    }
  }
  local_258.super__Vector_base<ncnn::Rect,_std::allocator<ncnn::Rect>_>._M_impl.
  super__Vector_impl_data._M_start = (Rect *)0x0;
  local_258.super__Vector_base<ncnn::Rect,_std::allocator<ncnn::Rect>_>._M_impl.
  super__Vector_impl_data._M_finish = (Rect *)0x0;
  local_258.super__Vector_base<ncnn::Rect,_std::allocator<ncnn::Rect>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (Rect *)0x0;
  local_238.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (float *)0x0;
  local_238.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_start = (float *)0x0;
  local_238.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_finish = (float *)0x0;
  if (0 < (int)local_198) {
    local_1e8 = (float)this->min_size * *(float *)(puVar13 + 1);
    uVar20 = 0;
    uVar28 = local_198;
    do {
      local_f0 = 1;
      if (local_178.dims != 3) {
        local_f0 = local_178.d;
      }
      local_100 = local_178.dims == 3 ^ 3;
      local_128.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage = (pointer)CONCAT44(local_178.elemsize._4_4_,(undefined4)local_178.elemsize)
      ;
      local_128.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_start = (pointer)((undefined1 *)local_178.data +
                          local_178.cstep * uVar20 *
                          (long)local_128.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                                super__Vector_impl_data._M_end_of_storage);
      local_128.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_finish = (pointer)0x0;
      local_110 = local_178.elempack;
      local_108 = local_178.allocator;
      local_fc = local_178.w;
      local_f8 = local_178.h;
      local_e8 = (long)local_178.h * (long)local_178.w;
      local_f4 = 1;
      if (0 < (int)_h) {
        lVar19 = (long)local_178.w *
                 (long)local_128.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                       super__Vector_impl_data._M_end_of_storage;
        pfVar25 = (float *)((undefined1 *)local_178.data +
                           local_178.cstep *
                           (long)local_128.super__Vector_base<float,_std::allocator<float>_>._M_impl
                                 .super__Vector_impl_data._M_end_of_storage * uVar20 + 0xc);
        __args = (float *)(local_218->elemsize * local_218->cstep * uVar28 + (long)local_218->data);
        uVar17 = local_1c8;
        do {
          fVar29 = pfVar25[-3];
          if ((local_1e8 <= (pfVar25[-1] + 1.0) - fVar29) &&
             (local_1e8 <= (*pfVar25 + 1.0) - pfVar25[-2])) {
            local_278._4_4_ = pfVar25[-2];
            local_278._0_4_ = fVar29;
            uStack_270._0_4_ = pfVar25[-1];
            uStack_270._4_4_ = *pfVar25;
            if (local_258.super__Vector_base<ncnn::Rect,_std::allocator<ncnn::Rect>_>._M_impl.
                super__Vector_impl_data._M_finish ==
                local_258.super__Vector_base<ncnn::Rect,_std::allocator<ncnn::Rect>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage) {
              std::vector<ncnn::Rect,std::allocator<ncnn::Rect>>::
              _M_realloc_insert<ncnn::Rect_const&>
                        ((vector<ncnn::Rect,std::allocator<ncnn::Rect>> *)&local_258,
                         (iterator)
                         local_258.super__Vector_base<ncnn::Rect,_std::allocator<ncnn::Rect>_>.
                         _M_impl.super__Vector_impl_data._M_finish,(Rect *)local_278);
            }
            else {
              (local_258.super__Vector_base<ncnn::Rect,_std::allocator<ncnn::Rect>_>._M_impl.
               super__Vector_impl_data._M_finish)->x1 = fVar29;
              (local_258.super__Vector_base<ncnn::Rect,_std::allocator<ncnn::Rect>_>._M_impl.
               super__Vector_impl_data._M_finish)->y1 = (float)local_278._4_4_;
              (local_258.super__Vector_base<ncnn::Rect,_std::allocator<ncnn::Rect>_>._M_impl.
               super__Vector_impl_data._M_finish)->x2 = (float)uStack_270;
              (local_258.super__Vector_base<ncnn::Rect,_std::allocator<ncnn::Rect>_>._M_impl.
               super__Vector_impl_data._M_finish)->y2 = uStack_270._4_4_;
              local_258.super__Vector_base<ncnn::Rect,_std::allocator<ncnn::Rect>_>._M_impl.
              super__Vector_impl_data._M_finish =
                   local_258.super__Vector_base<ncnn::Rect,_std::allocator<ncnn::Rect>_>._M_impl.
                   super__Vector_impl_data._M_finish + 1;
            }
            if (local_238.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                super__Vector_impl_data._M_finish ==
                local_238.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage) {
              std::vector<float,std::allocator<float>>::_M_realloc_insert<float_const&>
                        ((vector<float,std::allocator<float>> *)&local_238,
                         (iterator)
                         local_238.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                         super__Vector_impl_data._M_finish,__args);
            }
            else {
              *local_238.super__Vector_base<float,_std::allocator<float>_>._M_impl.
               super__Vector_impl_data._M_finish = *__args;
              local_238.super__Vector_base<float,_std::allocator<float>_>._M_impl.
              super__Vector_impl_data._M_finish =
                   local_238.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                   super__Vector_impl_data._M_finish + 1;
            }
          }
          pfVar25 = (float *)((long)pfVar25 + lVar19);
          __args = __args + 1;
          uVar17 = uVar17 - 1;
        } while (uVar17 != 0);
      }
      uVar20 = uVar20 + 1;
      uVar28 = uVar28 + 1;
    } while (uVar20 != local_198);
    if ((local_258.super__Vector_base<ncnn::Rect,_std::allocator<ncnn::Rect>_>._M_impl.
         super__Vector_impl_data._M_start !=
         local_258.super__Vector_base<ncnn::Rect,_std::allocator<ncnn::Rect>_>._M_impl.
         super__Vector_impl_data._M_finish) &&
       (local_238.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
        _M_start !=
        local_238.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
        _M_finish)) {
      qsort_descent_inplace<ncnn::Rect>
                (&local_258,&local_238,0,
                 (int)((ulong)((long)local_238.super__Vector_base<float,_std::allocator<float>_>.
                                     _M_impl.super__Vector_impl_data._M_finish -
                              (long)local_238.super__Vector_base<float,_std::allocator<float>_>.
                                    _M_impl.super__Vector_impl_data._M_start) >> 2) + -1);
    }
  }
  iVar15 = this->pre_nms_topN;
  if ((0 < (long)iVar15) &&
     (iVar15 < (int)((ulong)((long)local_258.
                                   super__Vector_base<ncnn::Rect,_std::allocator<ncnn::Rect>_>.
                                   _M_impl.super__Vector_impl_data._M_finish -
                            (long)local_258.
                                  super__Vector_base<ncnn::Rect,_std::allocator<ncnn::Rect>_>.
                                  _M_impl.super__Vector_impl_data._M_start) >> 4))) {
    std::vector<ncnn::Rect,_std::allocator<ncnn::Rect>_>::resize(&local_258,(long)iVar15);
    std::vector<float,_std::allocator<float>_>::resize(&local_238,(long)this->pre_nms_topN);
  }
  pRVar12 = local_258.super__Vector_base<ncnn::Rect,_std::allocator<ncnn::Rect>_>._M_impl.
            super__Vector_impl_data._M_finish;
  pRVar11 = local_258.super__Vector_base<ncnn::Rect,_std::allocator<ncnn::Rect>_>._M_impl.
            super__Vector_impl_data._M_start;
  local_278 = (undefined1  [8])0x0;
  uStack_270 = (unsigned_long *)0x0;
  local_268 = (unsigned_long *)0x0;
  local_1e8 = this->nms_thresh;
  uVar28 = (long)local_258.super__Vector_base<ncnn::Rect,_std::allocator<ncnn::Rect>_>._M_impl.
                 super__Vector_impl_data._M_finish -
           (long)local_258.super__Vector_base<ncnn::Rect,_std::allocator<ncnn::Rect>_>._M_impl.
                 super__Vector_impl_data._M_start >> 4;
  std::vector<float,_std::allocator<float>_>::vector(&local_128,uVar28,(allocator_type *)&local_200)
  ;
  if (pRVar12 != pRVar11) {
    pfVar25 = &(local_258.super__Vector_base<ncnn::Rect,_std::allocator<ncnn::Rect>_>._M_impl.
                super__Vector_impl_data._M_start)->x2;
    lVar19 = 0;
    do {
      uVar2 = ((Rect *)(pfVar25 + -2))->x1;
      uVar4 = ((Rect *)(pfVar25 + -2))->y1;
      local_128.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_start[lVar19] =
           ((float)((ulong)*(undefined8 *)pfVar25 >> 0x20) - (float)uVar4) *
           ((float)*(undefined8 *)pfVar25 - (float)uVar2);
      lVar19 = lVar19 + 1;
      pfVar25 = pfVar25 + 4;
    } while (uVar28 + (uVar28 == 0) != lVar19);
    local_200 = 0;
    do {
      if ((long)uStack_270 - (long)local_278 == 0) {
LAB_0020db97:
        if (uStack_270 == local_268) {
          std::vector<unsigned_long,std::allocator<unsigned_long>>::
          _M_realloc_insert<unsigned_long_const&>
                    ((vector<unsigned_long,std::allocator<unsigned_long>> *)local_278,uStack_270,
                     &local_200);
        }
        else {
          *uStack_270 = local_200;
          uStack_270 = uStack_270 + 1;
        }
      }
      else {
        lVar19 = (long)uStack_270 - (long)local_278 >> 3;
        fVar29 = local_258.super__Vector_base<ncnn::Rect,_std::allocator<ncnn::Rect>_>._M_impl.
                 super__Vector_impl_data._M_start[local_200].x1;
        bVar10 = true;
        lVar21 = 0;
        do {
          lVar5 = *(long *)((long)local_278 + lVar21 * 8);
          fVar30 = local_258.super__Vector_base<ncnn::Rect,_std::allocator<ncnn::Rect>_>._M_impl.
                   super__Vector_impl_data._M_start[lVar5].x2;
          fVar34 = 0.0;
          if (fVar29 <= fVar30) {
            pRVar18 = local_258.super__Vector_base<ncnn::Rect,_std::allocator<ncnn::Rect>_>._M_impl.
                      super__Vector_impl_data._M_start + lVar5;
            fVar32 = local_258.super__Vector_base<ncnn::Rect,_std::allocator<ncnn::Rect>_>._M_impl.
                     super__Vector_impl_data._M_start[local_200].x2;
            fVar33 = pRVar18->x1;
            if (fVar33 <= fVar32) {
              fVar35 = local_258.super__Vector_base<ncnn::Rect,_std::allocator<ncnn::Rect>_>._M_impl
                       .super__Vector_impl_data._M_start[local_200].y1;
              fVar36 = pRVar18->y2;
              if (fVar35 <= fVar36) {
                fVar1 = local_258.super__Vector_base<ncnn::Rect,_std::allocator<ncnn::Rect>_>.
                        _M_impl.super__Vector_impl_data._M_start[local_200].y2;
                fVar37 = pRVar18->y1;
                if (fVar37 <= fVar1) {
                  if (fVar32 <= fVar30) {
                    fVar30 = fVar32;
                  }
                  if (fVar33 <= fVar29) {
                    fVar33 = fVar29;
                  }
                  if (fVar1 <= fVar36) {
                    fVar36 = fVar1;
                  }
                  if (fVar37 <= fVar35) {
                    fVar37 = fVar35;
                  }
                  fVar34 = (fVar36 - fVar37) * (fVar30 - fVar33);
                }
              }
            }
          }
          if (local_1e8 <
              fVar34 / ((local_128.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                         super__Vector_impl_data._M_start[local_200] - fVar34) +
                       local_128.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                       super__Vector_impl_data._M_start[lVar5])) {
            bVar10 = false;
          }
          lVar21 = lVar21 + 1;
        } while (lVar19 + (ulong)(lVar19 == 0) != lVar21);
        if (bVar10) goto LAB_0020db97;
      }
      local_200 = local_200 + 1;
    } while (local_200 < uVar28);
  }
  if (local_128.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_128.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_128.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_128.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  uVar28 = (ulong)((long)uStack_270 - (long)local_278) >> 3;
  uVar20 = uVar28 & 0xffffffff;
  if (this->after_nms_topN < (int)uVar28) {
    uVar20 = (ulong)(uint)this->after_nms_topN;
  }
  this_00 = (local_1d0->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
            super__Vector_impl_data._M_start;
  iVar15 = (int)uVar20;
  Mat::create(this_00,4,1,iVar15,4,(Allocator *)0x0);
  iVar26 = -100;
  if ((this_00->data != (void *)0x0) && (sVar6 = this_00->cstep, (long)this_00->c * sVar6 != 0)) {
    if (0 < iVar15) {
      sVar7 = this_00->elemsize;
      pfVar25 = (float *)((long)this_00->data + 0xc);
      uVar28 = 0;
      do {
        lVar19 = *(long *)((long)local_278 + uVar28 * 8);
        pfVar25[-3] = local_258.super__Vector_base<ncnn::Rect,_std::allocator<ncnn::Rect>_>._M_impl.
                      super__Vector_impl_data._M_start[lVar19].x1;
        pfVar25[-2] = local_258.super__Vector_base<ncnn::Rect,_std::allocator<ncnn::Rect>_>._M_impl.
                      super__Vector_impl_data._M_start[lVar19].y1;
        pfVar25[-1] = local_258.super__Vector_base<ncnn::Rect,_std::allocator<ncnn::Rect>_>._M_impl.
                      super__Vector_impl_data._M_start[lVar19].x2;
        *pfVar25 = local_258.super__Vector_base<ncnn::Rect,_std::allocator<ncnn::Rect>_>._M_impl.
                   super__Vector_impl_data._M_start[lVar19].y2;
        uVar28 = uVar28 + 1;
        pfVar25 = (float *)((long)pfVar25 + sVar6 * sVar7);
      } while (uVar20 != uVar28);
    }
    pMVar8 = (local_1d0->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
             super__Vector_impl_data._M_start;
    iVar26 = 0;
    if (1 < (ulong)(((long)(local_1d0->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>).
                           _M_impl.super__Vector_impl_data._M_finish - (long)pMVar8 >> 3) *
                   -0x71c71c71c71c71c7)) {
      Mat::create(pMVar8 + 1,1,1,iVar15,4,(Allocator *)0x0);
      pfVar25 = (float *)pMVar8[1].data;
      iVar26 = -100;
      if (pfVar25 != (float *)0x0) {
        sVar6 = pMVar8[1].cstep;
        iVar26 = -100;
        if (((long)pMVar8[1].c * sVar6 != 0) && (iVar26 = 0, 0 < iVar15)) {
          sVar7 = pMVar8[1].elemsize;
          iVar26 = 0;
          uVar28 = 0;
          do {
            *pfVar25 = local_238.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                       super__Vector_impl_data._M_start[*(long *)((long)local_278 + uVar28 * 8)];
            uVar28 = uVar28 + 1;
            pfVar25 = (float *)((long)pfVar25 + sVar6 * sVar7);
          } while (uVar20 != uVar28);
        }
      }
    }
  }
  if (local_278 != (undefined1  [8])0x0) {
    operator_delete((void *)local_278,(long)local_268 - (long)local_278);
  }
  if (local_238.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_start != (float *)0x0) {
    operator_delete(local_238.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_238.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_238.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_258.super__Vector_base<ncnn::Rect,_std::allocator<ncnn::Rect>_>._M_impl.
      super__Vector_impl_data._M_start != (Rect *)0x0) {
    operator_delete(local_258.super__Vector_base<ncnn::Rect,_std::allocator<ncnn::Rect>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_258.super__Vector_base<ncnn::Rect,_std::allocator<ncnn::Rect>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_258.super__Vector_base<ncnn::Rect,_std::allocator<ncnn::Rect>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  piVar9 = (int *)CONCAT44(local_178.refcount._4_4_,local_178.refcount._0_4_);
  if (piVar9 != (int *)0x0) {
    LOCK();
    *piVar9 = *piVar9 + -1;
    UNLOCK();
    if (*piVar9 == 0) {
      if (local_178.allocator == (Allocator *)0x0) {
        if ((undefined1 (*) [16])local_178.data != (undefined1 (*) [16])0x0) {
          free(local_178.data);
        }
      }
      else {
        (*(local_178.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  return iVar26;
}

Assistant:

int Proposal::forward(const std::vector<Mat>& bottom_blobs, std::vector<Mat>& top_blobs, const Option& opt) const
{
    const Mat& score_blob = bottom_blobs[0];
    const Mat& bbox_blob = bottom_blobs[1];
    const Mat& im_info_blob = bottom_blobs[2];

    int w = score_blob.w;
    int h = score_blob.h;

    // generate proposals from bbox deltas and shifted anchors
    const int num_anchors = anchors.h;

    Mat proposals;
    proposals.create(4, w * h, num_anchors);

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int q = 0; q < num_anchors; q++)
    {
        const float* bbox_xptr = bbox_blob.channel(q * 4);
        const float* bbox_yptr = bbox_blob.channel(q * 4 + 1);
        const float* bbox_wptr = bbox_blob.channel(q * 4 + 2);
        const float* bbox_hptr = bbox_blob.channel(q * 4 + 3);

        Mat pbs = proposals.channel(q);

        const float* anchor = anchors.row(q);

        // shifted anchor
        float anchor_y = anchor[1];

        float anchor_w = anchor[2] - anchor[0];
        float anchor_h = anchor[3] - anchor[1];

        for (int i = 0; i < h; i++)
        {
            float anchor_x = anchor[0];

            for (int j = 0; j < w; j++)
            {
                float* pb = pbs.row(i * w + j);

                // apply center size
                float dx = bbox_xptr[j];
                float dy = bbox_yptr[j];
                float dw = bbox_wptr[j];
                float dh = bbox_hptr[j];

                float cx = anchor_x + anchor_w * 0.5f;
                float cy = anchor_y + anchor_h * 0.5f;

                float pb_cx = cx + anchor_w * dx;
                float pb_cy = cy + anchor_h * dy;

                float pb_w = static_cast<float>(anchor_w * exp(dw));
                float pb_h = static_cast<float>(anchor_h * exp(dh));

                pb[0] = pb_cx - pb_w * 0.5f;
                pb[1] = pb_cy - pb_h * 0.5f;
                pb[2] = pb_cx + pb_w * 0.5f;
                pb[3] = pb_cy + pb_h * 0.5f;

                anchor_x += feat_stride;
            }

            bbox_xptr += w;
            bbox_yptr += w;
            bbox_wptr += w;
            bbox_hptr += w;

            anchor_y += feat_stride;
        }
    }

    // clip predicted boxes to image
    float im_w = im_info_blob[1];
    float im_h = im_info_blob[0];

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int q = 0; q < num_anchors; q++)
    {
        Mat pbs = proposals.channel(q);

        for (int i = 0; i < w * h; i++)
        {
            float* pb = pbs.row(i);

            // clip box
            pb[0] = std::max(std::min(pb[0], im_w - 1), 0.f);
            pb[1] = std::max(std::min(pb[1], im_h - 1), 0.f);
            pb[2] = std::max(std::min(pb[2], im_w - 1), 0.f);
            pb[3] = std::max(std::min(pb[3], im_h - 1), 0.f);
        }
    }

    // remove predicted boxes with either height or width < threshold
    std::vector<Rect> proposal_boxes;
    std::vector<float> scores;

    float im_scale = im_info_blob[2];
    float min_boxsize = min_size * im_scale;

    for (int q = 0; q < num_anchors; q++)
    {
        Mat pbs = proposals.channel(q);
        const float* scoreptr = score_blob.channel(q + num_anchors);

        for (int i = 0; i < w * h; i++)
        {
            float* pb = pbs.row(i);

            float pb_w = pb[2] - pb[0] + 1;
            float pb_h = pb[3] - pb[1] + 1;

            if (pb_w >= min_boxsize && pb_h >= min_boxsize)
            {
                Rect r = {pb[0], pb[1], pb[2], pb[3]};
                proposal_boxes.push_back(r);
                scores.push_back(scoreptr[i]);
            }
        }
    }

    // sort all (proposal, score) pairs by score from highest to lowest
    qsort_descent_inplace(proposal_boxes, scores);

    // take top pre_nms_topN
    if (pre_nms_topN > 0 && pre_nms_topN < (int)proposal_boxes.size())
    {
        proposal_boxes.resize(pre_nms_topN);
        scores.resize(pre_nms_topN);
    }

    // apply nms with nms_thresh
    std::vector<size_t> picked;
    nms_sorted_bboxes(proposal_boxes, picked, nms_thresh);

    // take after_nms_topN
    int picked_count = std::min((int)picked.size(), after_nms_topN);

    // return the top proposals
    Mat& roi_blob = top_blobs[0];
    roi_blob.create(4, 1, picked_count);
    if (roi_blob.empty())
        return -100;

    for (int i = 0; i < picked_count; i++)
    {
        float* outptr = roi_blob.channel(i);

        outptr[0] = proposal_boxes[picked[i]].x1;
        outptr[1] = proposal_boxes[picked[i]].y1;
        outptr[2] = proposal_boxes[picked[i]].x2;
        outptr[3] = proposal_boxes[picked[i]].y2;
    }

    if (top_blobs.size() > 1)
    {
        Mat& roi_score_blob = top_blobs[1];
        roi_score_blob.create(1, 1, picked_count);
        if (roi_score_blob.empty())
            return -100;

        for (int i = 0; i < picked_count; i++)
        {
            float* outptr = roi_score_blob.channel(i);
            outptr[0] = scores[picked[i]];
        }
    }

    return 0;
}